

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O2

DataType __thiscall draco::PlyReader::GetDataTypeFromString(PlyReader *this,string *name)

{
  bool bVar1;
  DataType DVar2;
  
  bVar1 = std::operator==(name,"char");
  DVar2 = DT_INT8;
  if (!bVar1) {
    bVar1 = std::operator==(name,"int8");
    if (!bVar1) {
      bVar1 = std::operator==(name,"uchar");
      DVar2 = DT_UINT8;
      if (!bVar1) {
        bVar1 = std::operator==(name,"uint8");
        if (!bVar1) {
          bVar1 = std::operator==(name,"short");
          DVar2 = DT_INT16;
          if (!bVar1) {
            bVar1 = std::operator==(name,"int16");
            if (!bVar1) {
              bVar1 = std::operator==(name,"ushort");
              DVar2 = DT_UINT16;
              if (!bVar1) {
                bVar1 = std::operator==(name,"uint16");
                if (!bVar1) {
                  bVar1 = std::operator==(name,"int");
                  DVar2 = DT_INT32;
                  if (!bVar1) {
                    bVar1 = std::operator==(name,"int32");
                    if (!bVar1) {
                      bVar1 = std::operator==(name,"uint");
                      DVar2 = DT_UINT32;
                      if (!bVar1) {
                        bVar1 = std::operator==(name,"uint32");
                        if (!bVar1) {
                          bVar1 = std::operator==(name,"float");
                          DVar2 = DT_FLOAT32;
                          if (!bVar1) {
                            bVar1 = std::operator==(name,"float32");
                            if (!bVar1) {
                              bVar1 = std::operator==(name,"double");
                              if (bVar1) {
                                DVar2 = DT_FLOAT64;
                              }
                              else {
                                bVar1 = std::operator==(name,"float64");
                                DVar2 = DT_FLOAT64;
                                if (!bVar1) {
                                  DVar2 = DT_INVALID;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return DVar2;
}

Assistant:

DataType PlyReader::GetDataTypeFromString(const std::string &name) const {
  if (name == "char" || name == "int8") {
    return DT_INT8;
  }
  if (name == "uchar" || name == "uint8") {
    return DT_UINT8;
  }
  if (name == "short" || name == "int16") {
    return DT_INT16;
  }
  if (name == "ushort" || name == "uint16") {
    return DT_UINT16;
  }
  if (name == "int" || name == "int32") {
    return DT_INT32;
  }
  if (name == "uint" || name == "uint32") {
    return DT_UINT32;
  }
  if (name == "float" || name == "float32") {
    return DT_FLOAT32;
  }
  if (name == "double" || name == "float64") {
    return DT_FLOAT64;
  }
  return DT_INVALID;
}